

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int is_winzip_aes_encryption_supported(int encryption)

{
  size_t nbytes;
  int iVar1;
  int iVar2;
  int iVar3;
  size_t key_len;
  archive_hmac_sha1_ctx hctx;
  uint8_t salt [18];
  uint8_t derived_key [66];
  archive_crypto_ctx cctx;
  archive_hmac_sha1_ctx local_100;
  uint8_t local_f8 [32];
  uint8_t local_d8 [16];
  uint8_t auStack_c8 [64];
  archive_crypto_ctx local_88;
  
  nbytes = (ulong)(encryption != 2) * 8 + 8;
  iVar1 = archive_random(local_f8,nbytes);
  iVar2 = 0;
  iVar3 = 0;
  if (iVar1 == 0) {
    key_len = (ulong)(encryption != 2) * 0x10 + 0x10;
    iVar1 = pbkdf2_sha1("p",1,local_f8,nbytes,1000,local_d8,(ulong)(uint)((int)key_len * 2) | 2);
    iVar3 = iVar2;
    if (iVar1 == 0) {
      iVar1 = aes_ctr_init(&local_88,local_d8,key_len);
      if (iVar1 == 0) {
        iVar1 = __hmac_sha1_init(&local_100,auStack_c8 + (ulong)(encryption != 2) * 0x10,key_len);
        aes_ctr_release(&local_88);
        if (iVar1 == 0) {
          __hmac_sha1_cleanup(&local_100);
          iVar3 = 1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
is_winzip_aes_encryption_supported(int encryption)
{
	size_t key_len, salt_len;
	uint8_t salt[16 + 2];
	uint8_t derived_key[MAX_DERIVED_KEY_BUF_SIZE];
	archive_crypto_ctx cctx;
	archive_hmac_sha1_ctx hctx;
	int ret;

	if (encryption == ENCRYPTION_WINZIP_AES128) {
		salt_len = 8;
		key_len = 16;
	} else {
		/* AES 256 */
		salt_len = 16;
		key_len = 32;
	}
	if (archive_random(salt, salt_len) != ARCHIVE_OK)
		return (0);
	ret = archive_pbkdf2_sha1("p", 1, salt, salt_len, 1000,
	    derived_key, key_len * 2 + 2);
	if (ret != 0)
		return (0);

	ret = archive_encrypto_aes_ctr_init(&cctx, derived_key, key_len);
	if (ret != 0)
		return (0);
	ret = archive_hmac_sha1_init(&hctx, derived_key + key_len,
	    key_len);
	archive_encrypto_aes_ctr_release(&cctx);
	if (ret != 0)
		return (0);
	archive_hmac_sha1_cleanup(&hctx);
	return (1);
}